

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-rb.c
# Opt level: O0

pboolean p_tree_rb_remove(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                         PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,
                         pconstpointer key)

{
  pint pVar1;
  pboolean pVar2;
  PTreeBaseNode *local_70;
  PTreeBaseNode_ *pPStack_60;
  pint cmp_result;
  PTreeRBNode *child_parent;
  PTreeBaseNode *child_node;
  PTreeBaseNode *prev_node;
  PTreeBaseNode *cur_node;
  pconstpointer key_local;
  PDestroyFunc value_destroy_func_local;
  PDestroyFunc key_destroy_func_local;
  ppointer data_local;
  PCompareDataFunc compare_func_local;
  PTreeBaseNode **root_node_local;
  
  prev_node = *root_node;
  while (prev_node != (PTreeBaseNode *)0x0) {
    pVar1 = (*compare_func)(key,prev_node->key,data);
    if (pVar1 < 0) {
      prev_node = prev_node->left;
    }
    else {
      if (pVar1 < 1) break;
      prev_node = prev_node->right;
    }
  }
  if (prev_node == (PTreeBaseNode *)0x0) {
    root_node_local._4_4_ = 0;
  }
  else {
    if ((prev_node->left != (PTreeBaseNode_ *)0x0) && (prev_node->right != (PTreeBaseNode_ *)0x0)) {
      for (child_node = prev_node->left; child_node->right != (PTreeBaseNode_ *)0x0;
          child_node = child_node->right) {
      }
      prev_node->key = child_node->key;
      prev_node->value = child_node->value;
      prev_node = child_node;
    }
    if (prev_node->left == (PTreeBaseNode_ *)0x0) {
      local_70 = prev_node->right;
    }
    else {
      local_70 = prev_node->left;
    }
    if ((local_70 == (PTreeBaseNode *)0x0) &&
       (pVar2 = pp_tree_rb_is_black((PTreeRBNode *)prev_node), pVar2 == 1)) {
      pp_tree_rb_balance_remove((PTreeRBNode *)prev_node,root_node);
    }
    if (prev_node == *root_node) {
      *root_node = local_70;
      pPStack_60 = (PTreeBaseNode_ *)0x0;
    }
    else {
      pPStack_60 = prev_node[1].left;
      if (pPStack_60->left == prev_node) {
        pPStack_60->left = local_70;
      }
      else {
        pPStack_60->right = local_70;
      }
    }
    if (local_70 != (PTreeBaseNode *)0x0) {
      local_70[1].left = pPStack_60;
      pVar2 = pp_tree_rb_is_black((PTreeRBNode *)prev_node);
      if (pVar2 == 1) {
        *(undefined4 *)&local_70[1].right = 2;
      }
    }
    if (key_destroy_func != (PDestroyFunc)0x0) {
      (*key_destroy_func)(prev_node->key);
    }
    if (value_destroy_func != (PDestroyFunc)0x0) {
      (*value_destroy_func)(prev_node->value);
    }
    p_free(prev_node);
    root_node_local._4_4_ = 1;
  }
  return root_node_local._4_4_;
}

Assistant:

pboolean
p_tree_rb_remove (PTreeBaseNode		**root_node,
		  PCompareDataFunc	compare_func,
		  ppointer		data,
		  PDestroyFunc		key_destroy_func,
		  PDestroyFunc		value_destroy_func,
		  pconstpointer		key)
{
	PTreeBaseNode	*cur_node;
	PTreeBaseNode	*prev_node;
	PTreeBaseNode	*child_node;
	PTreeRBNode	*child_parent;
	pint		cmp_result;

	cur_node = *root_node;

	while (cur_node != NULL) {
		cmp_result = compare_func (key, cur_node->key, data);

		if (cmp_result < 0)
			cur_node = cur_node->left;
		else if (cmp_result > 0)
			cur_node = cur_node->right;
		else
			break;
	}

	if (P_UNLIKELY (cur_node == NULL))
		return FALSE;

	if (cur_node->left != NULL && cur_node->right != NULL) {
		prev_node = cur_node->left;

		while (prev_node->right != NULL)
			prev_node = prev_node->right;

		cur_node->key   = prev_node->key;
		cur_node->value = prev_node->value;

		/* Mark node for removal */
		cur_node = prev_node;
	}

	child_node = cur_node->left == NULL ? cur_node->right : cur_node->left;

	if (child_node == NULL && pp_tree_rb_is_black ((PTreeRBNode *) cur_node) == TRUE)
		pp_tree_rb_balance_remove ((PTreeRBNode *) cur_node, root_node);

	/* Replace node with its child */
	if (cur_node == *root_node) {
		*root_node   = child_node;
		child_parent = NULL;
	} else {
		child_parent = ((PTreeRBNode *) cur_node)->parent;

		if (child_parent->base.left == cur_node)
			child_parent->base.left = child_node;
		else
			child_parent->base.right = child_node;
	}

	if (child_node != NULL) {
		((PTreeRBNode *) child_node)->parent = child_parent;

		/* Check if we need to repaint the node */
		if (pp_tree_rb_is_black ((PTreeRBNode *) cur_node) == TRUE)
				((PTreeRBNode *) child_node)->color = P_TREE_RB_COLOR_BLACK;
	}

	/* Free unused node */
	if (key_destroy_func != NULL)
		key_destroy_func (cur_node->key);

	if (value_destroy_func != NULL)
		value_destroy_func (cur_node->value);

	p_free (cur_node);

	return TRUE;
}